

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O0

uint8_t * apx_attributeParser_parse_string_literal(uint8_t *begin,uint8_t *end,dtl_sv_t *sv)

{
  uint8_t *local_28;
  uint8_t *next;
  dtl_sv_t *sv_local;
  uint8_t *end_local;
  uint8_t *begin_local;
  
  if (end <= begin) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                  ,0x322,
                  "const uint8_t *apx_attributeParser_parse_string_literal(const uint8_t *, const uint8_t *, dtl_sv_t *)"
                 );
  }
  local_28 = bstr_match_pair(begin,end,'\"','\"','\\');
  if (begin < local_28) {
    if (end <= local_28) {
      __assert_fail("next < end",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                    ,0x326,
                    "const uint8_t *apx_attributeParser_parse_string_literal(const uint8_t *, const uint8_t *, dtl_sv_t *)"
                   );
    }
    dtl_sv_set_bstr(sv,begin + 1,local_28);
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

static uint8_t const* apx_attributeParser_parse_string_literal(uint8_t const* begin, uint8_t const* end, dtl_sv_t* sv)
{
   assert(begin < end);
   uint8_t const* next = bstr_match_pair(begin, end, '"', '"', '\\');
   if (next > begin)
   {
      assert(next < end);
      dtl_sv_set_bstr(sv, begin + 1, next);
      next++; //skip past ending '"' character
   }
   return next;
}